

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

bool __thiscall
EDLines::TryToJoinTwoLineSegments(EDLines *this,LineSegment *ls1,LineSegment *ls2,int changeIndex)

{
  LineSegment *__src;
  reference __dest;
  double dVar1;
  double dVar2;
  double dVar3;
  double local_78;
  double max;
  double d;
  LineSegment *longer;
  LineSegment *shorter;
  double nextLen;
  double prevLen;
  double dy;
  double dx;
  double dist;
  int which;
  int changeIndex_local;
  LineSegment *ls2_local;
  LineSegment *ls1_local;
  EDLines *this_local;
  
  dist._4_4_ = changeIndex;
  _which = ls2;
  ls2_local = ls1;
  ls1_local = (LineSegment *)this;
  dVar1 = ComputeMinDistanceBetweenTwoLines(ls1,ls2,(int *)&dist);
  if (dVar1 < this->max_distance_between_two_lines || dVar1 == this->max_distance_between_two_lines)
  {
    dVar1 = ls2_local->sx - ls2_local->ex;
    dVar2 = ls2_local->sy - ls2_local->ey;
    dVar1 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
    dVar2 = _which->sx - _which->ex;
    dVar3 = _which->sy - _which->ey;
    dVar2 = sqrt(dVar2 * dVar2 + dVar3 * dVar3);
    longer = ls2_local;
    d = (double)_which;
    if (dVar2 < dVar1) {
      longer = _which;
      d = (double)ls2_local;
    }
    dVar1 = ComputeMinDistance(longer->sx,longer->sy,*(double *)d,*(double *)((long)d + 8),
                               *(int *)((long)d + 0x10));
    dVar2 = ComputeMinDistance((longer->sx + longer->ex) / 2.0,(longer->sy + longer->ey) / 2.0,
                               *(double *)d,*(double *)((long)d + 8),*(int *)((long)d + 0x10));
    dVar3 = ComputeMinDistance(longer->ex,longer->ey,*(double *)d,*(double *)((long)d + 8),
                               *(int *)((long)d + 0x10));
    dVar1 = (dVar3 + dVar2 + dVar1) / 3.0;
    if (dVar1 < this->max_error || dVar1 == this->max_error) {
      local_78 = ABS(ls2_local->sx - _which->sx) + ABS(ls2_local->sy - _which->sy);
      dist._0_4_ = 1;
      dVar1 = ABS(ls2_local->sx - _which->ex) + ABS(ls2_local->sy - _which->ey);
      if (local_78 < dVar1) {
        dist._0_4_ = 2;
        local_78 = dVar1;
      }
      dVar1 = ABS(ls2_local->ex - _which->sx) + ABS(ls2_local->ey - _which->sy);
      if (local_78 < dVar1) {
        dist._0_4_ = 3;
        local_78 = dVar1;
      }
      if (local_78 < ABS(ls2_local->ex - _which->ex) + ABS(ls2_local->ey - _which->ey)) {
        dist._0_4_ = 4;
      }
      if (dist._0_4_ == 1) {
        ls2_local->ex = _which->sx;
        ls2_local->ey = _which->sy;
      }
      else if (dist._0_4_ == 2) {
        ls2_local->ex = _which->ex;
        ls2_local->ey = _which->ey;
      }
      else if (dist._0_4_ == 3) {
        ls2_local->sx = _which->sx;
        ls2_local->sy = _which->sy;
      }
      else {
        ls2_local->sx = ls2_local->ex;
        ls2_local->sy = ls2_local->ey;
        ls2_local->ex = _which->ex;
        ls2_local->ey = _which->ey;
      }
      if (ls2_local->firstPixelIndex + ls2_local->len + 5 < _which->firstPixelIndex) {
        if (ls2_local->len < _which->len) {
          ls2_local->firstPixelIndex = _which->firstPixelIndex;
          ls2_local->len = _which->len;
        }
      }
      else {
        ls2_local->len = _which->len + ls2_local->len;
      }
      UpdateLineParameters(ls2_local);
      __src = ls2_local;
      __dest = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)dist._4_4_);
      memcpy(__dest,__src,0x44);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EDLines::TryToJoinTwoLineSegments(LineSegment * ls1, LineSegment * ls2, int changeIndex)
{	
	int which;
	double dist = ComputeMinDistanceBetweenTwoLines(ls1, ls2, &which);
	if (dist > max_distance_between_two_lines) return false;

	// Compute line lengths. Use the longer one as the ground truth
	double dx = ls1->sx - ls1->ex;
	double dy = ls1->sy - ls1->ey;
	double prevLen = sqrt(dx*dx + dy*dy);

	dx = ls2->sx - ls2->ex;
	dy = ls2->sy - ls2->ey;
	double nextLen = sqrt(dx*dx + dy*dy);

	// Use the longer line as the ground truth
	LineSegment *shorter = ls1;
	LineSegment *longer = ls2;

	if (prevLen > nextLen) { shorter = ls2; longer = ls1; }

#if 0
	// Use 5 points to check for collinearity  
#define POINT_COUNT 5
	double decr = 1.0 / (POINT_COUNT - 1);
	double alpha = 1.0;
	dist = 0.0;

	while (alpha >= 0.0) {
		double px = alpha*shorter->sx + (1.0 - alpha)*shorter->ex;
		double py = alpha*shorter->sy + (1.0 - alpha)*shorter->ey;

		dist += ComputeMinDistance(px, py, longer->a, longer->b, longer->invert);

		alpha -= decr;
	} //end-while

	dist /= POINT_COUNT;

#undef POINT_COUNT

#else
	// Just use 3 points to check for collinearity  
	dist = ComputeMinDistance(shorter->sx, shorter->sy, longer->a, longer->b, longer->invert);
	dist += ComputeMinDistance((shorter->sx + shorter->ex) / 2.0, (shorter->sy + shorter->ey) / 2.0, longer->a, longer->b, longer->invert);
	dist += ComputeMinDistance(shorter->ex, shorter->ey, longer->a, longer->b, longer->invert);

	dist /= 3.0;
#endif

	if (dist > max_error) return false;

#if 0
	// Update the end points of ls1
	if (which == 0) {       // SS
		ls1->sx = ls2->ex;
		ls1->sy = ls2->ey;

	}
	else if (which == 1) { // SE
		ls1->sx = ls2->sx;
		ls1->sy = ls2->sy;

	}
	else if (which == 2) { // ES
		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;

	}
	else {                // EE
		ls1->ex = ls2->sx;
		ls1->ey = ls2->sy;
	} //end-else

#else
	/// 4 cases: 1:(s1, s2), 2:(s1, e2), 3:(e1, s2), 4:(e1, e2)

	/// case 1: (s1, s2)
	dx = fabs(ls1->sx - ls2->sx);
	dy = fabs(ls1->sy - ls2->sy);
	double d = dx + dy;
	double max = d;
	which = 1;

	/// case 2: (s1, e2)
	dx = fabs(ls1->sx - ls2->ex);
	dy = fabs(ls1->sy - ls2->ey);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 2;
	} //end-if

	  /// case 3: (e1, s2)
	dx = fabs(ls1->ex - ls2->sx);
	dy = fabs(ls1->ey - ls2->sy);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 3;
	} //end-if

	  /// case 4: (e1, e2)
	dx = fabs(ls1->ex - ls2->ex);
	dy = fabs(ls1->ey - ls2->ey);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 4;
	} //end-if

	if (which == 1) {
		// (s1, s2)
		ls1->ex = ls2->sx;
		ls1->ey = ls2->sy;

	}
	else if (which == 2) {
		// (s1, e2)
		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;

	}
	else if (which == 3) {
		// (e1, s2)
		ls1->sx = ls2->sx;
		ls1->sy = ls2->sy;

	}
	else {
		// (e1, e2)
		ls1->sx = ls1->ex;
		ls1->sy = ls1->ey;

		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;
	} //end-else

#endif

	  // Update the first line's parameters
	if (ls1->firstPixelIndex + ls1->len + 5 >= ls2->firstPixelIndex) ls1->len += ls2->len;
	else if (ls2->len > ls1->len) {
		ls1->firstPixelIndex = ls2->firstPixelIndex;
		ls1->len = ls2->len;
	} //end-if

	UpdateLineParameters(ls1);
	lines[changeIndex] = *ls1;

	return true;
}